

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

cio_error cio_websocket_read_message
                    (cio_websocket *websocket,cio_websocket_read_handler_t handler,
                    void *handler_context)

{
  cio_buffered_stream *buffered_stream;
  size_t num;
  cio_http_client *pcVar1;
  cio_error err;
  cio_error cVar2;
  cio_read_buffer *buffer;
  
  cVar2 = CIO_INVALID_ARGUMENT;
  if (handler != (cio_websocket_read_handler_t)0x0 && websocket != (cio_websocket *)0x0) {
    (websocket->ws_private).read_handler = handler;
    (websocket->ws_private).read_handler_context = handler_context;
    num = (websocket->ws_private).remaining_read_frame_length;
    pcVar1 = (websocket->ws_private).http_client;
    buffered_stream = &pcVar1->buffered_stream;
    buffer = &pcVar1->rb;
    if (num == 0) {
      err = cio_buffered_stream_read_at_least(buffered_stream,buffer,1,get_header,websocket);
    }
    else {
      err = cio_buffered_stream_read_at_most(buffered_stream,buffer,num,get_payload,websocket);
    }
    cVar2 = CIO_SUCCESS;
    if (err != CIO_SUCCESS) {
      handle_error(websocket,err,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "error while start reading websocket header");
      cVar2 = CIO_SUCCESS;
    }
  }
  return cVar2;
}

Assistant:

enum cio_error cio_websocket_read_message(struct cio_websocket *websocket, cio_websocket_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((websocket == NULL)) || (handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	websocket->ws_private.read_handler = handler;
	websocket->ws_private.read_handler_context = handler_context;
	struct cio_http_client *client = websocket->ws_private.http_client;
	enum cio_error err = CIO_SUCCESS;

	if (websocket->ws_private.remaining_read_frame_length == 0) {
		err = cio_buffered_stream_read_at_least(&client->buffered_stream, &client->rb, 1, get_header, websocket);
	} else {
		err = cio_buffered_stream_read_at_most(&client->buffered_stream, &client->rb, websocket->ws_private.remaining_read_frame_length, get_payload, websocket);
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket header");
	}

	return CIO_SUCCESS;
}